

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O1

void test_requirements<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>>(void)

{
  condition_variable *this;
  unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> lk;
  basic_shared_timed_mutex<yamc::rwlock::TaskFairness> mtx;
  unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_> local_b0;
  basic_shared_timed_mutex<yamc::rwlock::TaskFairness> local_a0;
  
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.queue_.status = 0;
  this = &local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.cv_;
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.queue_.next = (node *)&local_a0;
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.queue_.prev = (node *)&local_a0;
  std::condition_variable::condition_variable(this);
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.mtx_.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.mtx_.super___mutex_base._M_mutex.
  _16_8_ = 0;
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.mtx_.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.mtx_.super___mutex_base._M_mutex.
  __align = 0;
  local_a0.super_shared_mutex_base<yamc::rwlock::TaskFairness>.mtx_.super___mutex_base._M_mutex.
  _8_8_ = 0;
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::lock(&local_a0);
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::unlock(&local_a0);
  local_b0._M_owns = false;
  local_b0._M_device = &local_a0;
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::lock
            (&local_b0);
  local_b0._M_owns = true;
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~unique_lock
            (&local_b0);
  local_b0._M_device = &local_a0;
  local_b0._M_owns =
       yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::try_lock(&local_a0);
  std::unique_lock<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::~unique_lock
            (&local_b0);
  std::condition_variable::~condition_variable(this);
  return;
}

Assistant:

void test_requirements()
{
  Mutex mtx;
  // Mutex::lock(), unlock()
  {
    std::lock_guard<Mutex> lk(mtx);
  }
  {
    std::unique_lock<Mutex> lk(mtx);
  }
  // Mutex::try_lock()
  {
    std::unique_lock<Mutex> lk(mtx, std::try_to_lock);
  }
}